

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# label.cpp
# Opt level: O3

optional<jhu::thrax::(anonymous_namespace)::Concat> *
jhu::thrax::anon_unknown_0::concatenation
          (optional<jhu::thrax::(anonymous_namespace)::Concat> *__return_storage_ptr__,Tree *tree,
          Span nt)

{
  short sVar1;
  size_t sVar2;
  char *pcVar3;
  ulong uVar4;
  pointer pNVar5;
  difference_type __d_2;
  pointer pNVar6;
  ulong uVar7;
  short sVar8;
  ulong uVar9;
  ulong uVar11;
  pointer pNVar12;
  pointer pNVar13;
  optional<jhu::thrax::(anonymous_namespace)::Constituent> b;
  _Storage<jhu::thrax::(anonymous_namespace)::Constituent,_true> local_70;
  char local_60;
  ulong uVar10;
  
  pNVar5 = (tree->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>)._M_impl.
           super__Vector_impl_data._M_start;
  uVar7 = (long)(tree->super__Vector_base<jhu::thrax::Node,_std::allocator<jhu::thrax::Node>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pNVar5 >> 5;
  do {
    while( true ) {
      uVar4 = uVar7;
      if ((long)uVar4 < 1) goto LAB_00105cee;
      uVar7 = uVar4 >> 1;
      sVar1 = pNVar5[uVar7].span.start;
      sVar8 = nt.start;
      if (sVar8 <= sVar1) break;
      pNVar5 = pNVar5 + uVar7 + 1;
      uVar7 = ~uVar7 + uVar4;
    }
  } while (sVar8 < sVar1);
  uVar10 = uVar7;
  pNVar13 = pNVar5;
  if (1 < uVar4) {
    do {
      uVar9 = uVar10 >> 1;
      uVar11 = uVar9;
      if (pNVar13[uVar9].span.start < sVar8) {
        uVar11 = ~uVar9 + uVar10;
        pNVar13 = pNVar13 + uVar9 + 1;
      }
      uVar10 = uVar11;
    } while (0 < (long)uVar11);
  }
  pNVar12 = pNVar5 + uVar7 + 1;
  pNVar6 = (pointer)((long)((long)pNVar5 + (uVar4 * 0x20 - (long)pNVar12)) >> 5);
  while (pNVar5 = pNVar6, 0 < (long)pNVar5) {
    pNVar6 = (pointer)((ulong)pNVar5 >> 1);
    if (pNVar12[(long)pNVar6].span.start <= sVar8) {
      pNVar12 = pNVar12 + (long)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>
                                           *)&pNVar6->span)->_M_payload).
                                        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>
                                + 1);
      pNVar6 = (pointer)((long)&(((_Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>
                                   *)&pNVar5->span)->_M_payload).
                                super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>
                                ._M_payload + ~(ulong)pNVar6);
    }
  }
  if (pNVar13 < pNVar12) {
    do {
      pNVar5 = (pointer)constituent((optional<jhu::thrax::(anonymous_namespace)::Constituent> *)
                                    &local_70._M_value,tree,
                                    (Span)((uint)*(ushort *)
                                                  ((long)&(((
                                                  _Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>
                                                  *)&pNVar13->span)->_M_payload).
                                                  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>
                                                  + 2) | (uint)nt & 0xffff0000));
      if (local_60 == '\x01') {
        sVar2 = (pNVar13->label)._M_len;
        pcVar3 = (pNVar13->label)._M_str;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        b._M_len = local_70._M_value.label._M_len;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        b._M_str = local_70._M_value.label._M_str;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        a._M_len = sVar2;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_payload._M_value.
        a._M_str = pcVar3;
        (__return_storage_ptr__->
        super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
        super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_engaged = true;
        return (optional<jhu::thrax::(anonymous_namespace)::Concat> *)pNVar5;
      }
      pNVar13 = pNVar13 + 1;
    } while (pNVar13 < pNVar12);
  }
LAB_00105cee:
  (__return_storage_ptr__->
  super__Optional_base<jhu::thrax::(anonymous_namespace)::Concat,_true,_true>)._M_payload.
  super__Optional_payload_base<jhu::thrax::(anonymous_namespace)::Concat>._M_engaged = false;
  return (optional<jhu::thrax::(anonymous_namespace)::Concat> *)pNVar5;
}

Assistant:

std::optional<Concat> concatenation(const Tree& tree, Span nt) {
  auto [s, e] = std::equal_range(
      tree.begin(), tree.end(), Node{ nt, {}, nullptr }, byStart);
  for (auto it = s; it < e; it++) {
    auto b = constituent(tree, Span{ it->span.end, nt.end });
    if (b.has_value()) {
      return Concat{ it->label, b->label };
    }
  }
  return {};
}